

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Subprocess::Communicate
          (Subprocess *this,Message *input,Message *output,string *error)

{
  bool bVar1;
  uint __i;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  LogMessage *pLVar5;
  long lVar6;
  int *piVar7;
  char *pcVar8;
  ssize_t sVar9;
  bool bVar10;
  uint uVar11;
  string *this_00;
  int iVar12;
  int status;
  MessageLite *local_12f8;
  __sighandler_t local_12f0;
  string output_data;
  string input_data;
  string local_12a8;
  fd_set read_fds;
  SubstituteArg local_1208;
  fd_set write_fds;
  SubstituteArg local_1158;
  SubstituteArg local_1128;
  SubstituteArg local_10f8;
  SubstituteArg local_10c8;
  SubstituteArg local_1098;
  SubstituteArg local_1068;
  char buffer [4096];
  
  local_12f8 = &output->super_MessageLite;
  if (this->child_stdin_ == -1) {
    internal::LogMessage::LogMessage
              ((LogMessage *)buffer,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/subprocess.cc"
               ,0x15f);
    pLVar5 = internal::LogMessage::operator<<
                       ((LogMessage *)buffer,"CHECK failed: (child_stdin_) != (-1): ");
    pLVar5 = internal::LogMessage::operator<<(pLVar5,"Must call Start() first.");
    internal::LogFinisher::operator=((LogFinisher *)&read_fds,pLVar5);
    internal::LogMessage::~LogMessage((LogMessage *)buffer);
  }
  local_12f0 = signal(0xd,(__sighandler_t)0x1);
  MessageLite::SerializeAsString_abi_cxx11_(&input_data,&input->super_MessageLite);
  output_data._M_dataplus._M_p = (pointer)&output_data.field_2;
  output_data._M_string_length = 0;
  output_data.field_2._M_local_buf[0] = '\0';
  iVar3 = this->child_stdout_;
  iVar2 = this->child_stdin_;
  if (this->child_stdin_ <= iVar3) {
    iVar2 = iVar3;
  }
  iVar12 = 0;
  while (iVar3 != -1) {
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      read_fds.fds_bits[lVar6] = 0;
    }
    for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
      write_fds.fds_bits[lVar6] = 0;
    }
    read_fds.fds_bits[iVar3 / 0x40] = read_fds.fds_bits[iVar3 / 0x40] | 1L << ((byte)iVar3 & 0x3f);
    iVar3 = this->child_stdin_;
    if (iVar3 != -1) {
      write_fds.fds_bits[iVar3 / 0x40] =
           write_fds.fds_bits[iVar3 / 0x40] | 1L << ((byte)iVar3 & 0x3f);
    }
    iVar3 = select(iVar2 + 1,(fd_set *)&read_fds,(fd_set *)&write_fds,(fd_set *)0x0,(timeval *)0x0);
    if (iVar3 < 0) {
      piVar7 = __errno_location();
      if (*piVar7 != 4) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)buffer,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/subprocess.cc"
                   ,0x17e);
        pLVar5 = internal::LogMessage::operator<<((LogMessage *)buffer,"select: ");
        pcVar8 = strerror(*piVar7);
        pLVar5 = internal::LogMessage::operator<<(pLVar5,pcVar8);
        internal::LogFinisher::operator=((LogFinisher *)&local_1208,pLVar5);
        internal::LogMessage::~LogMessage((LogMessage *)buffer);
        goto LAB_0027198c;
      }
    }
    else {
LAB_0027198c:
      iVar3 = this->child_stdin_;
      if ((iVar3 != -1) &&
         (((ulong)write_fds.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0)) {
        sVar9 = write(iVar3,input_data._M_dataplus._M_p + iVar12,
                      input_data._M_string_length - (long)iVar12);
        iVar3 = iVar12 + (int)sVar9;
        iVar12 = (int)input_data._M_string_length;
        if (-1 < (int)sVar9) {
          iVar12 = iVar3;
        }
        if (input_data._M_string_length == (long)iVar12) {
          close(this->child_stdin_);
          this->child_stdin_ = -1;
        }
      }
      iVar3 = this->child_stdout_;
      if ((iVar3 != -1) &&
         (((ulong)read_fds.fds_bits[iVar3 / 0x40] >> ((long)iVar3 % 0x40 & 0x3fU) & 1) != 0)) {
        sVar9 = read(iVar3,(LogMessage *)buffer,0x1000);
        if ((int)sVar9 < 1) {
          close(this->child_stdout_);
          this->child_stdout_ = -1;
        }
        else {
          std::__cxx11::string::append((char *)&output_data,(ulong)buffer);
        }
      }
    }
    iVar3 = this->child_stdout_;
  }
  if (this->child_stdin_ != -1) {
    close(this->child_stdin_);
    this->child_stdin_ = -1;
  }
  while( true ) {
    _Var4 = waitpid(this->child_pid_,&status,0);
    if (_Var4 != -1) break;
    piVar7 = __errno_location();
    if (*piVar7 != 4) {
      internal::LogMessage::LogMessage
                ((LogMessage *)buffer,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/subprocess.cc"
                 ,0x1ac);
      pLVar5 = internal::LogMessage::operator<<((LogMessage *)buffer,"waitpid: ");
      pcVar8 = strerror(*piVar7);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,pcVar8);
      internal::LogFinisher::operator=((LogFinisher *)&read_fds,pLVar5);
      internal::LogMessage::~LogMessage((LogMessage *)buffer);
    }
  }
  signal(0xd,local_12f0);
  uVar11 = status & 0x7f;
  if (uVar11 == 0) {
    uVar11 = (uint)status >> 8 & 0xff;
    if (uVar11 != 0) {
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)buffer,uVar11);
      read_fds.fds_bits[0] = 0;
      read_fds.fds_bits[1]._0_4_ = 0xffffffff;
      write_fds.fds_bits[0] = 0;
      write_fds.fds_bits[1]._0_4_ = 0xffffffff;
      local_1208.text_ = (char *)0x0;
      local_1208.size_ = -1;
      local_1068.text_ = (char *)0x0;
      local_1068.size_ = -1;
      local_1098.text_ = (char *)0x0;
      local_1098.size_ = -1;
      local_10c8.text_ = (char *)0x0;
      local_10c8.size_ = -1;
      local_10f8.text_ = (char *)0x0;
      local_10f8.size_ = -1;
      local_1128.text_ = (char *)0x0;
      local_1128.size_ = -1;
      local_1158.text_ = (char *)0x0;
      local_1158.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_12a8,(strings *)"Plugin failed with status code $0.",buffer,
                 (SubstituteArg *)&read_fds,(SubstituteArg *)&write_fds,&local_1208,&local_1068,
                 &local_1098,&local_10c8,&local_10f8,&local_1128,&local_1158,(SubstituteArg *)error)
      ;
      goto LAB_00271cbc;
    }
    bVar1 = MessageLite::ParseFromString(local_12f8,&output_data);
    bVar10 = true;
    if (bVar1) goto LAB_00271ce9;
    CEscape((string *)&read_fds,&output_data);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer,
                   "Plugin output is unparseable: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&read_fds);
    std::__cxx11::string::operator=((string *)error,(string *)buffer);
    std::__cxx11::string::~string((string *)buffer);
    this_00 = (string *)&read_fds;
LAB_00271cd0:
    std::__cxx11::string::~string((string *)this_00);
  }
  else {
    if (0x1ffffff < (int)(uVar11 * 0x1000000 + 0x1000000)) {
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)buffer,uVar11);
      read_fds.fds_bits[0] = 0;
      read_fds.fds_bits[1]._0_4_ = 0xffffffff;
      write_fds.fds_bits[0] = 0;
      write_fds.fds_bits[1]._0_4_ = 0xffffffff;
      local_1208.text_ = (char *)0x0;
      local_1208.size_ = -1;
      local_1068.text_ = (char *)0x0;
      local_1068.size_ = -1;
      local_1098.text_ = (char *)0x0;
      local_1098.size_ = -1;
      local_10c8.text_ = (char *)0x0;
      local_10c8.size_ = -1;
      local_10f8.text_ = (char *)0x0;
      local_10f8.size_ = -1;
      local_1128.text_ = (char *)0x0;
      local_1128.size_ = -1;
      local_1158.text_ = (char *)0x0;
      local_1158.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_12a8,(strings *)"Plugin killed by signal $0.",buffer,
                 (SubstituteArg *)&read_fds,(SubstituteArg *)&write_fds,&local_1208,&local_1068,
                 &local_1098,&local_10c8,&local_10f8,&local_1128,&local_1158,(SubstituteArg *)error)
      ;
LAB_00271cbc:
      this_00 = &local_12a8;
      std::__cxx11::string::operator=((string *)error,(string *)this_00);
      goto LAB_00271cd0;
    }
    std::__cxx11::string::assign((char *)error);
  }
  bVar10 = false;
LAB_00271ce9:
  std::__cxx11::string::~string((string *)&output_data);
  std::__cxx11::string::~string((string *)&input_data);
  return bVar10;
}

Assistant:

bool Subprocess::Communicate(const Message& input, Message* output,
                             string* error) {

  GOOGLE_CHECK_NE(child_stdin_, -1) << "Must call Start() first.";

  // The "sighandler_t" typedef is GNU-specific, so define our own.
  typedef void SignalHandler(int);

  // Make sure SIGPIPE is disabled so that if the child dies it doesn't kill us.
  SignalHandler* old_pipe_handler = signal(SIGPIPE, SIG_IGN);

  string input_data = input.SerializeAsString();
  string output_data;

  int input_pos = 0;
  int max_fd = std::max(child_stdin_, child_stdout_);

  while (child_stdout_ != -1) {
    fd_set read_fds;
    fd_set write_fds;
    FD_ZERO(&read_fds);
    FD_ZERO(&write_fds);
    if (child_stdout_ != -1) {
      FD_SET(child_stdout_, &read_fds);
    }
    if (child_stdin_ != -1) {
      FD_SET(child_stdin_, &write_fds);
    }

    if (select(max_fd + 1, &read_fds, &write_fds, NULL, NULL) < 0) {
      if (errno == EINTR) {
        // Interrupted by signal.  Try again.
        continue;
      } else {
        GOOGLE_LOG(FATAL) << "select: " << strerror(errno);
      }
    }

    if (child_stdin_ != -1 && FD_ISSET(child_stdin_, &write_fds)) {
      int n = write(child_stdin_, input_data.data() + input_pos,
                                  input_data.size() - input_pos);
      if (n < 0) {
        // Child closed pipe.  Presumably it will report an error later.
        // Pretend we're done for now.
        input_pos = input_data.size();
      } else {
        input_pos += n;
      }

      if (input_pos == input_data.size()) {
        // We're done writing.  Close.
        close(child_stdin_);
        child_stdin_ = -1;
      }
    }

    if (child_stdout_ != -1 && FD_ISSET(child_stdout_, &read_fds)) {
      char buffer[4096];
      int n = read(child_stdout_, buffer, sizeof(buffer));

      if (n > 0) {
        output_data.append(buffer, n);
      } else {
        // We're done reading.  Close.
        close(child_stdout_);
        child_stdout_ = -1;
      }
    }
  }

  if (child_stdin_ != -1) {
    // Child did not finish reading input before it closed the output.
    // Presumably it exited with an error.
    close(child_stdin_);
    child_stdin_ = -1;
  }

  int status;
  while (waitpid(child_pid_, &status, 0) == -1) {
    if (errno != EINTR) {
      GOOGLE_LOG(FATAL) << "waitpid: " << strerror(errno);
    }
  }

  // Restore SIGPIPE handling.
  signal(SIGPIPE, old_pipe_handler);

  if (WIFEXITED(status)) {
    if (WEXITSTATUS(status) != 0) {
      int error_code = WEXITSTATUS(status);
      *error = strings::Substitute(
          "Plugin failed with status code $0.", error_code);
      return false;
    }
  } else if (WIFSIGNALED(status)) {
    int signal = WTERMSIG(status);
    *error = strings::Substitute(
        "Plugin killed by signal $0.", signal);
    return false;
  } else {
    *error = "Neither WEXITSTATUS nor WTERMSIG is true?";
    return false;
  }

  if (!output->ParseFromString(output_data)) {
    *error = "Plugin output is unparseable: " + CEscape(output_data);
    return false;
  }

  return true;
}